

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_2::Image::clearChannels(Image *this)

{
  long lVar1;
  ImageLevel **ppIVar2;
  long in_RDI;
  int x;
  int y;
  int local_10;
  int local_c;
  
  local_c = 0;
  while( true ) {
    lVar1 = Array2D<Imf_3_2::ImageLevel_*>::height
                      ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
    if (lVar1 <= local_c) break;
    local_10 = 0;
    while( true ) {
      lVar1 = Array2D<Imf_3_2::ImageLevel_*>::width
                        ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
      if (lVar1 <= local_10) break;
      ppIVar2 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                          ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_c);
      if (ppIVar2[local_10] != (ImageLevel *)0x0) {
        ppIVar2 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_c);
        (*ppIVar2[local_10]->_vptr_ImageLevel[6])();
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
           *)0x131b6f);
  return;
}

Assistant:

void
Image::clearChannels ()
{
    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->clearChannels ();

    _channels.clear ();
}